

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# T.c
# Opt level: O0

int envy_bios_parse_bit_T(envy_bios *bios,envy_bios_bit_entry *bit)

{
  int iVar1;
  uint local_24;
  uint idx;
  envy_bios_T *t;
  envy_bios_bit_entry *bit_local;
  envy_bios *bios_local;
  
  local_24 = 0;
  (bios->T).bit = bit;
  while( true ) {
    iVar1 = parse_at(bios,local_24,(char **)0x0);
    if (iVar1 != 0) break;
    local_24 = local_24 + 1;
  }
  envy_bios_parse_T_tmds_info(bios);
  return 0;
}

Assistant:

int
envy_bios_parse_bit_T(struct envy_bios *bios, struct envy_bios_bit_entry *bit)
{
	struct envy_bios_T *t = &bios->T;
	unsigned int idx = 0;

	t->bit = bit;

	while (!parse_at(bios, idx, NULL))
		idx++;

	/* parse tables */
	envy_bios_parse_T_tmds_info(bios);

	return 0;
}